

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O1

void __thiscall test::OWDTimeStatistics::AddSample(OWDTimeStatistics *this,uint64_t owdUsec)

{
  uint uVar1;
  uint uVar2;
  
  if (this->SampleCount < 1000) {
    this->SampleCount = this->SampleCount + 1;
  }
  uVar1 = this->SampleIndex;
  (this->Samples)._M_elems[uVar1] = owdUsec;
  uVar1 = uVar1 + 1;
  uVar2 = 0;
  if (uVar1 < 1000) {
    uVar2 = uVar1;
  }
  this->SampleIndex = uVar2;
  return;
}

Assistant:

void OWDTimeStatistics::AddSample(uint64_t owdUsec)
{
    if (SampleCount < kMaxSamples)
        ++SampleCount;

    Samples[SampleIndex] = owdUsec;

    // Pick next sample index
    if (++SampleIndex >= kMaxSamples)
        SampleIndex = 0;
}